

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O0

uint32_t __thiscall RegistryValue::GetDword(RegistryValue *this)

{
  uint32_t uVar1;
  string *psVar2;
  size_type sVar3;
  RegistryValue *this_local;
  
  if (this->m_dwType != 4) {
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_(psVar2,"GetDword: not a dword: %d",(ulong)this->m_dwType);
    __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
  if (sVar3 != 4) {
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
    stringformat_abi_cxx11_(psVar2,"GetDword: incorrect size: %d",sVar3);
    __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  uVar1 = BV_GetDword(&this->m_data);
  return uVar1;
}

Assistant:

uint32_t GetDword() const
    {
        if (m_dwType!=REG_DWORD) throw stringformat("GetDword: not a dword: %d", m_dwType);
        if (m_data.size()!=4) throw stringformat("GetDword: incorrect size: %d", m_data.size());

        return BV_GetDword(m_data);
    }